

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O3

void __thiscall sRGB_Conversion_Test::~sRGB_Conversion_Test(sRGB_Conversion_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(sRGB, Conversion) {
    // Check the basic 8 bit values
    for (int i = 0; i < 256; ++i) {
        Float x = SRGBToLinear(i * (1.f / 255.f));
        Float y = SRGB8ToLinear(i);
        EXPECT_LT(std::abs(x - y), 1e-5);
    }

    // Round trip to linear and back
    for (int i = 0; i < 256; ++i) {
        Float x = SRGBToLinear(i * (1.f / 255.f));
        Float y = LinearToSRGB(x) * 255.f;
        EXPECT_LT(std::abs(i - y), 1e-4);
    }

    // Round trip the other way
    for (int i = 0; i < 256; ++i) {
        Float x = LinearToSRGB(i * (1.f / 255.f));
        Float y = SRGBToLinear(x) * 255.f;
        EXPECT_LT(std::abs(i - y), 3e-4) <<
            StringPrintf("i = %d -> linear %f -> srgb %f", i, x, y);
    }
}